

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O1

void emit_lib(BuildCtx *ctx)

{
  char **ppcVar1;
  bool bVar2;
  bool bVar3;
  FILE *pFVar4;
  FILE *pFVar5;
  int iVar6;
  FILE *pFVar7;
  int iVar8;
  FILE *unaff_RBP;
  undefined1 *puVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  LibDefHandler *unaff_R13;
  uint8_t *puVar13;
  uint uVar14;
  ulong unaff_R15;
  bool bVar15;
  char buf [256];
  char acStack_1d0 [88];
  BuildCtx *pBStack_178;
  char *pcStack_170;
  LibDefHandler *pLStack_168;
  FILE *pFStack_160;
  ulong uStack_158;
  FILE *pFStack_150;
  undefined8 local_140;
  FILE local_138;
  
  if (ctx->mode - BUILD_ffdef < 3) {
    pFVar7 = (FILE *)ctx->fp;
    pcVar11 = "/* This is a generated file. DO NOT EDIT! */\n\n";
    sVar10 = 0x2e;
LAB_0010a72e:
    pFStack_150 = (FILE *)0x10a738;
    fwrite(pcVar11,sVar10,1,pFVar7);
  }
  else if (ctx->mode == BUILD_vmdef) {
    pFVar7 = (FILE *)ctx->fp;
    pcVar11 = "ffnames = {\n[0]=\"Lua\",\n\"C\",\n";
    sVar10 = 0x1c;
    goto LAB_0010a72e;
  }
  if (ctx->mode == BUILD_recdef) {
    pFStack_150 = (FILE *)0x10a758;
    fwrite("static const uint16_t recff_idmap[] = {\n0,\n0x0100",0x31,1,(FILE *)ctx->fp);
  }
  ffid = 2;
  recffid = 2;
  ffasmfunc = 0;
  while( true ) {
    ppcVar1 = ctx->args;
    ctx->args = ppcVar1 + 1;
    pcVar11 = *ppcVar1;
    if (pcVar11 == (char *)0x0) break;
    if ((*pcVar11 != '-') || (pFVar7 = _stdin, pcVar11[1] != '\0')) {
      pFStack_150 = (FILE *)0x10a7ad;
      pFVar7 = fopen(pcVar11,"r");
      if (pFVar7 == (FILE *)0x0) {
LAB_0010ab79:
        pFStack_150 = (FILE *)libdef_endmodule;
        pcVar12 = pcVar11;
        emit_lib_cold_1();
        if (modstate != 0) {
          pBStack_178 = ctx;
          pcStack_170 = pcVar11;
          pLStack_168 = unaff_R13;
          pFStack_160 = pFVar7;
          uStack_158 = unaff_R15;
          pFStack_150 = unaff_RBP;
          if (modstate == 1) {
            fwrite("  (lua_CFunction)0",0x12,1,*(FILE **)(pcVar12 + 0x10));
          }
          fwrite("\n};\n",4,1,*(FILE **)(pcVar12 + 0x10));
          fprintf(*(FILE **)(pcVar12 + 0x10),"static const uint8_t %s%s[] = {\n","lj_lib_init_",
                  modname);
          acStack_1d0[0] = '\0';
          puVar13 = obuf;
          if (obuf < optr) {
            iVar8 = 0;
            do {
              iVar6 = sprintf(acStack_1d0 + iVar8,"%d,",(ulong)*puVar13);
              iVar8 = iVar8 + iVar6;
              if (0x4a < iVar8) {
                iVar8 = 0;
                fprintf(*(FILE **)(pcVar12 + 0x10),"%s\n",acStack_1d0);
                acStack_1d0[0] = '\0';
              }
              puVar13 = puVar13 + 1;
            } while (puVar13 < optr);
          }
          fprintf(*(FILE **)(pcVar12 + 0x10),"%s%d\n};\n#endif\n\n",acStack_1d0,0xff);
        }
        return;
      }
    }
    modstate = 0;
    regfunc = 0;
    pFStack_150 = (FILE *)0x10a7d9;
    pcVar11 = fgets((char *)&local_138,0x100,pFVar7);
    pFVar5 = pFVar7;
    pFVar4 = local_140;
    while (local_140 = pFVar5, pcVar11 != (char *)0x0) {
      if ((((byte)local_138._flags == 0x23) && (local_138._flags._1_1_ == 'i')) &&
         (local_138._flags._2_1_ == 'f')) {
        pFStack_150 = (FILE *)0x10a815;
        sVar10 = strlen((char *)&local_138);
        if ((*(char *)((long)&local_138 + (sVar10 - 1)) == '\n') &&
           (*(undefined1 *)((long)&local_140 + sVar10 + 7) = 0,
           *(char *)((long)&local_140 + sVar10 + 6) == '\r')) {
          *(undefined1 *)((long)&local_140 + sVar10 + 6) = 0;
        }
        unaff_RBP = (FILE *)0x0;
        bVar2 = (short)local_138._IO_read_ptr != 0x32;
        bVar3 = CONCAT53(local_138._3_5_,
                         CONCAT12(local_138._flags._2_1_,
                                  CONCAT11(local_138._flags._1_1_,(byte)local_138._flags))) !=
                0x355f4a4c20666923;
        bVar15 = bVar2 || bVar3;
        if (bVar15) goto LAB_0010a8d2;
        pFStack_150 = (FILE *)0x10a868;
        pcVar11 = fgets((char *)&local_138,0x100,local_140);
        if (pcVar11 != (char *)0x0) {
          unaff_R15 = 1;
          do {
            if (local_138._flags._2_1_ == 'n' &&
                (local_138._flags._1_1_ == 'e' && ((byte)local_138._flags ^ 0x23) == 0)) {
              uVar14 = (int)unaff_R15 - 1;
              unaff_R15 = (ulong)uVar14;
              if (uVar14 == 0) break;
            }
            else {
              unaff_R15 = (ulong)((int)unaff_R15 +
                                 (uint)(local_138._flags._2_1_ == 'f' &&
                                       (((byte)local_138._flags ^ 0x23) == 0 &&
                                       local_138._flags._1_1_ == 'i')));
            }
            pFStack_150 = (FILE *)0x10a8c2;
            pcVar11 = fgets((char *)&local_138,0x100,local_140);
          } while (pcVar11 != (char *)0x0);
        }
        unaff_RBP = (FILE *)(ulong)bVar15;
        if (bVar2 || bVar3) goto LAB_0010a8d2;
      }
      else {
LAB_0010a8d2:
        pFVar7 = &local_138;
        while( true ) {
          pFStack_150 = (FILE *)0x10a8e6;
          pcVar11 = strstr((char *)pFVar7,"LJLIB_");
          if (pcVar11 == (char *)0x0) break;
          pFVar7 = (FILE *)(pcVar11 + 6);
          unaff_R15 = 0;
          unaff_R13 = libdef_handlers + 1;
          pcVar11 = "MODULE_";
          do {
            pFStack_150 = (FILE *)0x10a90f;
            unaff_RBP = (FILE *)strlen(pcVar11);
            pFStack_150 = (FILE *)0x10a920;
            uVar14 = strncmp((char *)pFVar7,pcVar11,(size_t)unaff_RBP);
            pcVar11 = (char *)(ulong)uVar14;
            if (uVar14 == 0) {
              pFVar7 = (FILE *)((long)&unaff_RBP->_flags + (long)&pFVar7->_flags);
              if (unaff_R13[-1].stop == (char *)0x0) {
                unaff_RBP = (FILE *)0x0;
              }
              else {
                pFStack_150 = (FILE *)0x10a93b;
                unaff_RBP = (FILE *)strcspn((char *)pFVar7,unaff_R13[-1].stop);
              }
              if (*(char *)((long)&unaff_RBP->_flags + (long)&pFVar7->_flags) != '\0') {
                puVar9 = (undefined1 *)((long)&pFVar7->_flags + (long)&unaff_RBP->_flags);
                *puVar9 = 0;
                pFStack_150 = (FILE *)0x10a95e;
                (*unaff_R13[-1].func)(ctx,(char *)pFVar7,unaff_R13[-1].arg);
                unaff_RBP = (FILE *)(puVar9 + 1);
                pFVar7 = unaff_RBP;
              }
            }
            if (uVar14 == 0) break;
            pcVar11 = unaff_R13->suffix;
            unaff_R13 = unaff_R13 + 1;
            unaff_R15 = (ulong)(pcVar11 == (char *)0x0);
          } while (pcVar11 != (char *)0x0);
          if (unaff_R15 != 0) {
            pFStack_150 = (FILE *)0x10ab79;
            emit_lib_cold_2();
            goto LAB_0010ab79;
          }
        }
      }
      pFVar7 = local_140;
      pFStack_150 = (FILE *)0x10a9a0;
      pcVar11 = fgets((char *)&local_138,0x100,local_140);
      pFVar5 = local_140;
      pFVar4 = local_140;
    }
    pFStack_150 = (FILE *)0x10a9b1;
    local_140 = pFVar4;
    fclose(pFVar7);
    if (ctx->mode == BUILD_libdef) {
      pFStack_150 = (FILE *)0x10a9c3;
      libdef_endmodule(ctx);
    }
  }
  switch(ctx->mode) {
  case BUILD_bcdef:
    pFStack_150 = (FILE *)0x10aa10;
    fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
    pFStack_150 = (FILE *)0x10aa2a;
    fwrite("LJ_DATADEF const uint16_t lj_bc_mode[] = {\n",0x2b,1,(FILE *)ctx->fp);
    pFStack_150 = (FILE *)0x10aa44;
    fwrite("BCDEF(BCMODE)\n",0xe,1,(FILE *)ctx->fp);
    if (1 < ffasmfunc) {
      iVar8 = ffasmfunc + 1;
      do {
        pFStack_150 = (FILE *)0x10aa6e;
        fwrite("BCMODE_FF,\n",0xb,1,(FILE *)ctx->fp);
        iVar8 = iVar8 + -1;
      } while (2 < iVar8);
    }
    pFVar7 = (FILE *)ctx->fp;
    pcVar11 = "BCMODE_FF\n};\n\n";
    sVar10 = 0xe;
    break;
  case BUILD_ffdef:
    pFStack_150 = (FILE *)0x10ab26;
    fwrite("\n#undef FFDEF\n\n",0xf,1,(FILE *)ctx->fp);
    pFStack_150 = (FILE *)0x10ab3e;
    fprintf((FILE *)ctx->fp,"#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
            (ulong)(uint)ffasmfunc);
    return;
  default:
    goto switchD_0010a9f4_caseD_7;
  case BUILD_recdef:
    pFStack_150 = (FILE *)0x10aaa4;
    fwrite("\n};\n\n",5,1,(FILE *)ctx->fp);
    pFStack_150 = (FILE *)0x10aabe;
    fwrite("static const RecordFunc recff_func[] = {\nrecff_nyi,\nrecff_c",0x3b,1,(FILE *)ctx->fp);
    if (obuf[0] != '\0') {
      puVar13 = obuf;
      do {
        pFStack_150 = (FILE *)0x10aae6;
        fprintf((FILE *)ctx->fp,",\nrecff_%s",puVar13);
        pFStack_150 = (FILE *)0x10aaee;
        sVar10 = strlen((char *)puVar13);
        puVar13 = puVar13 + sVar10 + 1;
      } while (*puVar13 != '\0');
    }
    pFVar7 = (FILE *)ctx->fp;
    pcVar11 = "\n};\n\n";
    sVar10 = 5;
    break;
  case BUILD_vmdef:
    pFVar7 = (FILE *)ctx->fp;
    pcVar11 = "},\n\n";
    sVar10 = 4;
  }
  pFStack_150 = (FILE *)0x10ab5a;
  fwrite(pcVar11,sVar10,1,pFVar7);
switchD_0010a9f4_caseD_7:
  return;
}

Assistant:

void emit_lib(BuildCtx *ctx)
{
  const char *fname;

  if (ctx->mode == BUILD_ffdef || ctx->mode == BUILD_libdef ||
      ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "/* This is a generated file. DO NOT EDIT! */\n\n");
  else if (ctx->mode == BUILD_vmdef)
    fprintf(ctx->fp, "ffnames = {\n[0]=\"Lua\",\n\"C\",\n");
  if (ctx->mode == BUILD_recdef)
    fprintf(ctx->fp, "static const uint16_t recff_idmap[] = {\n0,\n0x0100");
  recffid = ffid = FF_C+1;
  ffasmfunc = 0;

  while ((fname = *ctx->args++)) {
    char buf[256];  /* We don't care about analyzing lines longer than that. */
    FILE *fp;
    if (fname[0] == '-' && fname[1] == '\0') {
      fp = stdin;
    } else {
      fp = fopen(fname, "r");
      if (!fp) {
	fprintf(stderr, "Error: cannot open input file '%s': %s\n",
		fname, strerror(errno));
	exit(1);
      }
    }
    modstate = 0;
    regfunc = REGFUNC_OK;
    while (fgets(buf, sizeof(buf), fp) != NULL) {
      char *p;
      /* Simplistic pre-processor. Only handles top-level #if/#endif. */
      if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
	int ok = 1;
	size_t len = strlen(buf);
	if (buf[len-1] == '\n') {
	  buf[len-1] = 0;
	  if (buf[len-2] == '\r') {
	    buf[len-2] = 0;
	  }
	}
	if (!strcmp(buf, "#if LJ_52"))
	  ok = LJ_52;
	else if (!strcmp(buf, "#if LJ_HASJIT"))
	  ok = LJ_HASJIT;
	else if (!strcmp(buf, "#if LJ_HASFFI"))
	  ok = LJ_HASFFI;
	else if (!strcmp(buf, "#if LJ_HASBUFFER"))
	  ok = LJ_HASBUFFER;
	if (!ok) {
	  int lvl = 1;
	  while (fgets(buf, sizeof(buf), fp) != NULL) {
	    if (buf[0] == '#' && buf[1] == 'e' && buf[2] == 'n') {
	      if (--lvl == 0) break;
	    } else if (buf[0] == '#' && buf[1] == 'i' && buf[2] == 'f') {
	      lvl++;
	    }
	  }
	  continue;
	}
      }
      for (p = buf; (p = strstr(p, LIBDEF_PREFIX)) != NULL; ) {
	const LibDefHandler *ldh;
	p += sizeof(LIBDEF_PREFIX)-1;
	for (ldh = libdef_handlers; ldh->suffix != NULL; ldh++) {
	  size_t n, len = strlen(ldh->suffix);
	  if (!strncmp(p, ldh->suffix, len)) {
	    p += len;
	    n = ldh->stop ? strcspn(p, ldh->stop) : 0;
	    if (!p[n]) break;
	    p[n] = '\0';
	    ldh->func(ctx, p, ldh->arg);
	    p += n+1;
	    break;
	  }
	}
	if (ldh->suffix == NULL) {
	  buf[strlen(buf)-1] = '\0';
	  fprintf(stderr, "Error: unknown library definition tag %s%s\n",
		  LIBDEF_PREFIX, p);
	  exit(1);
	}
      }
    }
    fclose(fp);
    if (ctx->mode == BUILD_libdef) {
      libdef_endmodule(ctx);
    }
  }

  if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "\n#undef FFDEF\n\n");
    fprintf(ctx->fp,
      "#ifndef FF_NUM_ASMFUNC\n#define FF_NUM_ASMFUNC %d\n#endif\n\n",
      ffasmfunc);
  } else if (ctx->mode == BUILD_vmdef) {
    fprintf(ctx->fp, "},\n\n");
  } else if (ctx->mode == BUILD_bcdef) {
    int i;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "LJ_DATADEF const uint16_t lj_bc_mode[] = {\n");
    fprintf(ctx->fp, "BCDEF(BCMODE)\n");
    for (i = ffasmfunc-1; i > 0; i--)
      fprintf(ctx->fp, "BCMODE_FF,\n");
    fprintf(ctx->fp, "BCMODE_FF\n};\n\n");
  } else if (ctx->mode == BUILD_recdef) {
    char *p = (char *)obuf;
    fprintf(ctx->fp, "\n};\n\n");
    fprintf(ctx->fp, "static const RecordFunc recff_func[] = {\n"
	    "recff_nyi,\n"
	    "recff_c");
    while (*p) {
      fprintf(ctx->fp, ",\nrecff_%s", p);
      p += strlen(p)+1;
    }
    fprintf(ctx->fp, "\n};\n\n");
  }
}